

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O2

bool __thiscall Js::RecyclableObject::IsWritableDataOnlyDetectionBitSet(RecyclableObject *this)

{
  bool bVar1;
  DynamicObject *this_00;
  DynamicTypeHandler *this_01;
  
  while( true ) {
    bVar1 = DynamicType::Is(**(TypeId **)((long)this + 8));
    if (!bVar1) {
      return false;
    }
    this_00 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(this);
    this_01 = DynamicObject::GetTypeHandler(this_00);
    bVar1 = DynamicTypeHandler::IsWritableDataOnlyDetectionBitSet(this_01);
    if (bVar1) break;
    bVar1 = DynamicObject::HasObjectArray(this_00);
    if (!bVar1) {
      return false;
    }
    this = *(RecyclableObject **)&this_00->field_1;
  }
  return true;
}

Assistant:

bool RecyclableObject::IsWritableDataOnlyDetectionBitSet()
    {
        if (DynamicType::Is(this->GetTypeId()))
        {
            DynamicObject* obj = UnsafeVarTo<DynamicObject>(this);
            return obj->GetTypeHandler()->IsWritableDataOnlyDetectionBitSet() ||
                (obj->HasObjectArray() && obj->GetObjectArrayOrFlagsAsArray()->IsWritableDataOnlyDetectionBitSet());
        }

        return false;
    }